

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

void addJsonArray(QJsonArray *array,QString *keyPrefix,ProValueMap *map)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_const_QString_&> local_b0;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<QString> local_68;
  QStringBuilder<const_QString_&,_QLatin1String> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  uVar1 = QJsonArray::size();
  QList<QString>::reserve((QList<QString> *)&local_68,(long)(int)uVar1);
  uVar2 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QString::number((int)&local_88,(int)uVar2);
    QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_68,(QString *)&local_88);
    QJsonArray::at((longlong)&local_50);
    local_b0.a = keyPrefix;
    local_b0.b = (QString *)&local_88;
    QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_a0,&local_b0);
    addJsonValue((QJsonValue *)&local_50,(QString *)&local_a0,map);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QJsonValue::~QJsonValue((QJsonValue *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  local_50.b.m_size = QtPrivate::lengthHelperPointer<char>("_KEYS_");
  local_50.b.m_data = "_KEYS_";
  local_50.a = keyPrefix;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>((QString *)&local_88,&local_50)
  ;
  insertJsonKeyValue((QString *)&local_88,(QStringList *)&local_68,map);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonArray(const QJsonArray &array, const QString &keyPrefix, ProValueMap *map)
{
    QStringList keys;
    const int size = array.count();
    keys.reserve(size);
    for (int i = 0; i < size; ++i) {
        const QString number = QString::number(i);
        keys.append(number);
        addJsonValue(array.at(i), keyPrefix + number, map);
    }
    insertJsonKeyValue(keyPrefix + QLatin1String("_KEYS_"), keys, map);
}